

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_ghosts(Integer g_a,Integer *width)

{
  long lVar1;
  global_array_t *pgVar2;
  global_array_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set ghost widths on array that has been allocated",0);
  }
  if (GA[lVar5].ndim < 1) {
    pnga_error("Dimensions must be set before array widths are specified",0);
  }
  lVar6 = 0;
  while( true ) {
    pgVar3 = GA;
    lVar4 = (long)GA[lVar5].ndim;
    if (lVar4 <= lVar6) break;
    lVar4 = width[lVar6];
    if (GA[g_a + 1000].dims[lVar6] < lVar4) {
      pnga_error("Boundary width must be <= corresponding dimension",lVar6);
      lVar4 = width[lVar6];
    }
    if (lVar4 < 0) {
      pnga_error("Boundary width must be >= 0",lVar6);
    }
    lVar6 = lVar6 + 1;
  }
  pgVar2 = GA + lVar5;
  lVar6 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar6;
  }
  for (; lVar4 != lVar6; lVar6 = lVar6 + 1) {
    lVar1 = width[lVar6];
    pgVar3[lVar5].width[lVar6] = lVar1;
    if (0 < lVar1) {
      pgVar2->ghosts = 1;
    }
  }
  return;
}

Assistant:

void pnga_set_ghosts(Integer g_a, Integer *width)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set ghost widths on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before array widths are specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if ((C_Integer)width[i] > GA[ga_handle].dims[i])
      pnga_error("Boundary width must be <= corresponding dimension",i);
    if ((C_Integer)width[i] < 0)
      pnga_error("Boundary width must be >= 0",i);
  }
  for (i=0; i<GA[ga_handle].ndim; i++) {
    GA[ga_handle].width[i] = (C_Integer)width[i];
    if (width[i] > 0) GA[ga_handle].ghosts = 1;
  }
}